

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>
               *this,int i)

{
  double dVar1;
  Fad<double> *pFVar2;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar4;
  Fad<double> *pFVar5;
  Fad<double> *pFVar6;
  Fad<double> *pFVar7;
  
  pFVar2 = (this->left_->fadexpr_).right_;
  dVar1 = (this->left_->fadexpr_).left_.constant_;
  pFVar3 = (this->right_->fadexpr_).left_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  pFVar5 = (pFVar3->fadexpr_).right_;
  pFVar6 = (pFVar4->fadexpr_).left_;
  pFVar7 = (pFVar4->fadexpr_).right_;
  return dVar1 * pFVar2->val_ *
         ((*(double **)((long)&pFVar6->dx_ + 8))[i] + (pFVar7->dx_).ptr_to_data[i] +
         (pFVar5->dx_).ptr_to_data[i]) +
         ((pFVar6->val_ + pFVar7->val_ + pFVar5->val_) - (this->right_->fadexpr_).right_.constant_)
         * (pFVar2->dx_).ptr_to_data[i] * dVar1;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}